

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGCompareNameClasses
              (xmlRelaxNGDefinePtr_conflict def1,xmlRelaxNGDefinePtr_conflict def2)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  undefined8 uVar5;
  xmlGenericErrorFunc p_Var6;
  void *pvVar7;
  bool bVar8;
  xmlNs ns;
  xmlNode node;
  xmlRelaxNGValidCtxt ctxt;
  xmlNs xStack_188;
  xmlNode local_158;
  xmlRelaxNGValidCtxt local_e0;
  
  memset(&local_e0,0,0xc0);
  local_e0.flags = 9;
  switch(def1->type) {
  case XML_RELAXNG_EXCEPT:
    iVar2 = xmlRelaxNGCompareNameClasses(def1->content,def2);
    bVar8 = iVar2 != 0;
LAB_001771c0:
    if (bVar8) {
      return 0;
    }
    break;
  case XML_RELAXNG_TEXT:
    return (uint)(def2->type != XML_RELAXNG_TEXT);
  case XML_RELAXNG_ELEMENT:
  case XML_RELAXNG_ATTRIBUTE:
    if (def2->type == XML_RELAXNG_TEXT) {
      return 1;
    }
    local_158.name = (xmlChar *)"\x01";
    if (def1->name != (xmlChar *)0x0) {
      local_158.name = def1->name;
    }
    pxVar1 = def1->ns;
    if ((pxVar1 == (xmlChar *)0x0) || (local_158.ns = &xStack_188, *pxVar1 == '\0')) {
      local_158.ns = (xmlNs *)0x0;
      pxVar1 = xStack_188.href;
    }
    xStack_188.href = pxVar1;
    iVar2 = xmlRelaxNGElementMatch(&local_e0,def2,&local_158);
    if (iVar2 != 0) {
      if (def1->nameClass == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar2 = xmlRelaxNGCompareNameClasses(def1->nameClass,def2);
      bVar8 = iVar2 == 0;
      goto LAB_001771c0;
    }
    break;
  default:
    pp_Var3 = __xmlGenericError();
    p_Var6 = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    pvVar7 = *ppvVar4;
    uVar5 = 0xf0b;
    goto LAB_0017722e;
  }
  if ((def2->type == XML_RELAXNG_ATTRIBUTE) || (def2->type == XML_RELAXNG_ELEMENT)) {
    local_158.name = def2->name;
    if (local_158.name == (xmlChar *)0x0) {
      local_158.name = "\x01";
    }
    pxVar1 = def2->ns;
    if (pxVar1 == (xmlChar *)0x0) {
      xStack_188.href = "\x01";
      pxVar1 = xStack_188.href;
      local_158.ns = &xStack_188;
    }
    else {
      local_158.ns = &xStack_188;
      if (*pxVar1 == '\0') {
        local_158.ns = (xmlNs *)0x0;
        pxVar1 = xStack_188.href;
      }
    }
    xStack_188.href = pxVar1;
    iVar2 = xmlRelaxNGElementMatch(&local_e0,def1,&local_158);
    if (iVar2 != 0) {
      if (def2->nameClass == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar2 = xmlRelaxNGCompareNameClasses(def2->nameClass,def1);
      return iVar2;
    }
    return 1;
  }
  pp_Var3 = __xmlGenericError();
  p_Var6 = *pp_Var3;
  ppvVar4 = __xmlGenericErrorContext();
  pvVar7 = *ppvVar4;
  uVar5 = 0xf2a;
LAB_0017722e:
  (*p_Var6)(pvVar7,"Unimplemented block at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/relaxng.c",
            uVar5);
  return 0;
}

Assistant:

static int
xmlRelaxNGCompareNameClasses(xmlRelaxNGDefinePtr def1,
                             xmlRelaxNGDefinePtr def2)
{
    int ret = 1;
    xmlNode node;
    xmlNs ns;
    xmlRelaxNGValidCtxt ctxt;

    memset(&ctxt, 0, sizeof(xmlRelaxNGValidCtxt));

    ctxt.flags = FLAGS_IGNORABLE | FLAGS_NOERROR;

    if ((def1->type == XML_RELAXNG_ELEMENT) ||
        (def1->type == XML_RELAXNG_ATTRIBUTE)) {
        if (def2->type == XML_RELAXNG_TEXT)
            return (1);
        if (def1->name != NULL) {
            node.name = def1->name;
        } else {
            node.name = invalidName;
        }
        if (def1->ns != NULL) {
            if (def1->ns[0] == 0) {
                node.ns = NULL;
            } else {
	        node.ns = &ns;
                ns.href = def1->ns;
            }
        } else {
            node.ns = NULL;
        }
        if (xmlRelaxNGElementMatch(&ctxt, def2, &node)) {
            if (def1->nameClass != NULL) {
                ret = xmlRelaxNGCompareNameClasses(def1->nameClass, def2);
            } else {
                ret = 0;
            }
        } else {
            ret = 1;
        }
    } else if (def1->type == XML_RELAXNG_TEXT) {
        if (def2->type == XML_RELAXNG_TEXT)
            return (0);
        return (1);
    } else if (def1->type == XML_RELAXNG_EXCEPT) {
        ret = xmlRelaxNGCompareNameClasses(def1->content, def2);
	if (ret == 0)
	    ret = 1;
	else if (ret == 1)
	    ret = 0;
    } else {
        TODO ret = 0;
    }
    if (ret == 0)
        return (ret);
    if ((def2->type == XML_RELAXNG_ELEMENT) ||
        (def2->type == XML_RELAXNG_ATTRIBUTE)) {
        if (def2->name != NULL) {
            node.name = def2->name;
        } else {
            node.name = invalidName;
        }
        node.ns = &ns;
        if (def2->ns != NULL) {
            if (def2->ns[0] == 0) {
                node.ns = NULL;
            } else {
                ns.href = def2->ns;
            }
        } else {
            ns.href = invalidName;
        }
        if (xmlRelaxNGElementMatch(&ctxt, def1, &node)) {
            if (def2->nameClass != NULL) {
                ret = xmlRelaxNGCompareNameClasses(def2->nameClass, def1);
            } else {
                ret = 0;
            }
        } else {
            ret = 1;
        }
    } else {
        TODO ret = 0;
    }

    return (ret);
}